

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O2

boolean bad_rock(permonst *mdat,boolean is_player,xchar x,xchar y)

{
  uint uVar1;
  level *lev;
  boolean bVar2;
  obj *poVar3;
  
  if ((u.uz.dnum == dungeon_topology.d_sokoban_dnum) &&
     (poVar3 = sobj_at(0x214,level,(int)x,(int)y), poVar3 != (obj *)0x0)) {
    return '\x01';
  }
  lev = level;
  if ((level->locations[x][y].typ < '\x11') &&
     ((uVar1 = mdat->mflags1, (uVar1 & 0x60) != 0x20 || (bVar2 = may_dig(level,x,y), bVar2 == '\0'))
     )) {
    bVar2 = may_passwall(lev,x,y);
    if (bVar2 == '\0') {
      return '\x01';
    }
    if ((uVar1 & 8) == 0) {
      if (is_player == '\0') {
        return '\x01';
      }
      if (u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0) {
        return ((youmonst.data)->mflags1 & 8) == 0;
      }
    }
  }
  return '\0';
}

Assistant:

boolean bad_rock(const struct permonst *mdat, boolean is_player, xchar x, xchar y)
{
	return (boolean) ((In_sokoban(&u.uz) && sobj_at(BOULDER, level, x,y)) ||
	       (IS_ROCK(level->locations[x][y].typ)
		    && (!tunnels(mdat) || needspick(mdat) || !may_dig(level, x,y))
		    && !(may_passwall(level, x,y)
			&& (passes_walls(mdat) || (is_player && Passes_walls)))));
}